

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoreClient.cpp
# Opt level: O2

Enum __thiscall ViconDataStreamSDK::Core::VClient::ClearSubjectFilter(VClient *this)

{
  VFilter *this_00;
  element_type *peVar1;
  
  this_00 = &this->m_Filter;
  ViconCGStream::VFilter::Clear(this_00,2);
  ViconCGStream::VFilter::Clear(this_00,9);
  ViconCGStream::VFilter::Clear(this_00,8);
  ViconCGStream::VFilter::Clear(this_00,0x385);
  ViconCGStream::VFilter::Clear(this_00,0x6d61);
  ViconCGStream::VFilter::Clear(this_00,0x1c);
  peVar1 = (this->m_pClient).
           super___shared_ptr<ViconCGStreamClientSDK::ICGClient,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (*peVar1->_vptr_ICGClient[0xc])(peVar1,this_00);
  return Success;
}

Assistant:

Result::Enum VClient::ClearSubjectFilter()
{
  m_Filter.Clear(ViconCGStreamEnum::SubjectInfo);
  m_Filter.Clear( ViconCGStreamEnum::GlobalSegments );
  m_Filter.Clear( ViconCGStreamEnum::LocalSegments );
  m_Filter.Clear( ViconCGStreamEnum::LightweightSegments );
  m_Filter.Clear( ViconCGStreamEnum::SubjectScale );
  m_Filter.Clear( ViconCGStreamEnum::SubjectTopology );

  m_pClient->SetFilter(m_Filter);

  return Result::Success;
}